

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall inja::ParserStatic::ParserStatic(ParserStatic *this)

{
  string_view local_1b0;
  string_view local_1a0;
  string_view local_190;
  string_view local_180;
  string_view local_170;
  string_view local_160;
  string_view local_150;
  string_view local_140;
  string_view local_130;
  string_view local_120;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40 [2];
  string_view local_20;
  ParserStatic *local_10;
  ParserStatic *this_local;
  
  local_10 = this;
  FunctionStorage::FunctionStorage(&this->functions);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"default");
  FunctionStorage::add_builtin(&this->functions,local_20,2,Default);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_40,"divisibleBy");
  FunctionStorage::add_builtin(&this->functions,local_40[0],2,DivisibleBy);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"even");
  FunctionStorage::add_builtin(&this->functions,local_50,1,Even);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,"first");
  FunctionStorage::add_builtin(&this->functions,local_60,1,First);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,"float");
  FunctionStorage::add_builtin(&this->functions,local_70,1,Float);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_80,"int");
  FunctionStorage::add_builtin(&this->functions,local_80,1,Int);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,"last");
  FunctionStorage::add_builtin(&this->functions,local_90,1,Last);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a0,"length");
  FunctionStorage::add_builtin(&this->functions,local_a0,1,Length);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,"lower");
  FunctionStorage::add_builtin(&this->functions,local_b0,1,Lower);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c0,"max");
  FunctionStorage::add_builtin(&this->functions,local_c0,1,Max);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d0,"min");
  FunctionStorage::add_builtin(&this->functions,local_d0,1,Min);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e0,"odd");
  FunctionStorage::add_builtin(&this->functions,local_e0,1,Odd);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f0,"range");
  FunctionStorage::add_builtin(&this->functions,local_f0,1,Range);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_100,"round");
  FunctionStorage::add_builtin(&this->functions,local_100,2,Round);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_110,"sort");
  FunctionStorage::add_builtin(&this->functions,local_110,1,Sort);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_120,"upper");
  FunctionStorage::add_builtin(&this->functions,local_120,1,Upper);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_130,"exists");
  FunctionStorage::add_builtin(&this->functions,local_130,1,Exists);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_140,"existsIn");
  FunctionStorage::add_builtin(&this->functions,local_140,2,ExistsInObject);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_150,"isBoolean");
  FunctionStorage::add_builtin(&this->functions,local_150,1,IsBoolean);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_160,"isNumber");
  FunctionStorage::add_builtin(&this->functions,local_160,1,IsNumber);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,"isInteger");
  FunctionStorage::add_builtin(&this->functions,local_170,1,IsInteger);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_180,"isFloat");
  FunctionStorage::add_builtin(&this->functions,local_180,1,IsFloat);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,"isObject");
  FunctionStorage::add_builtin(&this->functions,local_190,1,IsObject);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a0,"isArray");
  FunctionStorage::add_builtin(&this->functions,local_1a0,1,IsArray);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b0,"isString");
  FunctionStorage::add_builtin(&this->functions,local_1b0,1,IsString);
  return;
}

Assistant:

ParserStatic() {
		functions.add_builtin("default", 2, Bytecode::Op::Default);
		functions.add_builtin("divisibleBy", 2, Bytecode::Op::DivisibleBy);
		functions.add_builtin("even", 1, Bytecode::Op::Even);
		functions.add_builtin("first", 1, Bytecode::Op::First);
		functions.add_builtin("float", 1, Bytecode::Op::Float);
		functions.add_builtin("int", 1, Bytecode::Op::Int);
		functions.add_builtin("last", 1, Bytecode::Op::Last);
		functions.add_builtin("length", 1, Bytecode::Op::Length);
		functions.add_builtin("lower", 1, Bytecode::Op::Lower);
		functions.add_builtin("max", 1, Bytecode::Op::Max);
		functions.add_builtin("min", 1, Bytecode::Op::Min);
		functions.add_builtin("odd", 1, Bytecode::Op::Odd);
		functions.add_builtin("range", 1, Bytecode::Op::Range);
		functions.add_builtin("round", 2, Bytecode::Op::Round);
		functions.add_builtin("sort", 1, Bytecode::Op::Sort);
		functions.add_builtin("upper", 1, Bytecode::Op::Upper);
		functions.add_builtin("exists", 1, Bytecode::Op::Exists);
		functions.add_builtin("existsIn", 2, Bytecode::Op::ExistsInObject);
		functions.add_builtin("isBoolean", 1, Bytecode::Op::IsBoolean);
		functions.add_builtin("isNumber", 1, Bytecode::Op::IsNumber);
		functions.add_builtin("isInteger", 1, Bytecode::Op::IsInteger);
		functions.add_builtin("isFloat", 1, Bytecode::Op::IsFloat);
		functions.add_builtin("isObject", 1, Bytecode::Op::IsObject);
		functions.add_builtin("isArray", 1, Bytecode::Op::IsArray);
		functions.add_builtin("isString", 1, Bytecode::Op::IsString);
	}